

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_json.cpp
# Opt level: O3

char * udf_json_get_value(UDF_INIT *initid,UDF_ARGS *args,char *result,unsigned_long *length,
                         char *is_null,char *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  Json json;
  string local_120;
  string local_100;
  Json local_e0;
  
  if ((*args->arg_type == STRING_RESULT) && (args->arg_type[1] == STRING_RESULT)) {
    pcVar2 = *args->args;
    if ((pcVar2 != (char *)0x0) && (args->args[1] != (char *)0x0)) {
      paVar1 = &local_120.field_2;
      local_120._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,pcVar2,pcVar2 + *args->lengths);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,args->args[1],args->args[1] + args->lengths[1]);
      Json::Json(&local_e0,&local_120,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar1) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      bVar4 = Json::IsValid(&local_e0);
      if (bVar4) {
        Json::Str_abi_cxx11_(&local_120,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != paVar1) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if (local_120._M_string_length < 0x100) {
          Json::Str_abi_cxx11_(&local_120,&local_e0);
          _Var3._M_p = local_120._M_dataplus._M_p;
          strncpy(result,local_120._M_dataplus._M_p,local_120._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var3._M_p != paVar1) {
            operator_delete(_Var3._M_p);
          }
          *length = local_120._M_string_length;
        }
        else {
          pcVar2 = initid->ptr;
          Json::Str_abi_cxx11_(&local_120,&local_e0);
          _Var3._M_p = local_120._M_dataplus._M_p;
          strncpy(pcVar2,local_120._M_dataplus._M_p,local_120._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var3._M_p != paVar1) {
            operator_delete(_Var3._M_p);
          }
          initid->ptr[local_120._M_string_length - 1] = '\0';
          result = initid->ptr;
        }
      }
      else {
        result = (char *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.msg._M_dataplus._M_p != &local_e0.msg.field_2) {
        operator_delete(local_e0.msg._M_dataplus._M_p);
      }
      rapidjson::
      GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
      ::~GenericDocument(&local_e0.d);
      if (local_e0.p.nameBuffer_ != (Ch *)0x0) {
        free(local_e0.p.tokens_);
      }
      operator_delete(local_e0.p.ownAllocator_);
      return result;
    }
  }
  return (char *)0x0;
}

Assistant:

char* udf_json_get_value(UDF_INIT* initid, UDF_ARGS* args, char* result, unsigned long* length, char* is_null, char *error)
{
    if (args->arg_type[0] != STRING_RESULT
        || args->arg_type[1] != STRING_RESULT
        || args->args[0] == NULL
        || args->args[1] == NULL    )
    {
        return NULL;
    }

    Json json(std::string(args->args[0], args->lengths[0]), std::string(args->args[1], args->lengths[1]));
    if (!json.IsValid()) {
        return NULL;
    }
    size_t len = json.Str().size();
    if (len < 256) {
        strncpy(result, json.Str().c_str(), len);
        *length = len;
        return result;
    } else {
        strncpy(initid->ptr, json.Str().c_str(), len);
        initid->ptr[len - 1] = 0;
        return initid->ptr;
    }
}